

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
testing::internal2::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,CfdErrorCode *x)

{
  CfdErrorCode *in_RSI;
  basic_ostream<char,_std::char_traits<char>_> *in_RDI;
  ostream *in_stack_ffffffffffffffe8;
  
  TypeWithoutFormatter<CfdErrorCode,_(testing::internal2::TypeKind)1>::PrintValue
            (in_RSI,in_stack_ffffffffffffffe8);
  return in_RDI;
}

Assistant:

::std::basic_ostream<Char, CharTraits>& operator<<(
    ::std::basic_ostream<Char, CharTraits>& os, const T& x) {
  TypeWithoutFormatter<T, (internal::IsAProtocolMessage<T>::value
                               ? kProtobuf
                               : internal::ImplicitlyConvertible<
                                     const T&, internal::BiggestInt>::value
                                     ? kConvertibleToInteger
                                     :
#if GTEST_HAS_ABSL
                                     internal::ImplicitlyConvertible<
                                         const T&, absl::string_view>::value
                                         ? kConvertibleToStringView
                                         :
#endif
                                         kOtherType)>::PrintValue(x, &os);
  return os;
}